

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O1

void google::protobuf::internal::WireFormatLite::WriteSInt64
               (int field_number,int64 value,CodedOutputStream *output)

{
  bool bVar1;
  uint uVar2;
  byte *pbVar3;
  uint8 *puVar4;
  ulong uVar5;
  uint uVar6;
  byte *pbVar7;
  ulong uVar8;
  
  uVar6 = field_number << 3;
  if ((output->impl_).end_ <= output->cur_) {
    puVar4 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,output->cur_);
    output->cur_ = puVar4;
  }
  pbVar7 = output->cur_;
  if (uVar6 < 0x80) {
    *pbVar7 = (byte)uVar6;
    pbVar7 = pbVar7 + 1;
  }
  else {
    *pbVar7 = (byte)uVar6 | 0x80;
    if (uVar6 < 0x4000) {
      pbVar7[1] = (byte)(uVar6 >> 7);
      pbVar7 = pbVar7 + 2;
    }
    else {
      pbVar7 = pbVar7 + 2;
      uVar6 = uVar6 >> 7;
      do {
        pbVar3 = pbVar7;
        pbVar3[-1] = (byte)uVar6 | 0x80;
        uVar2 = uVar6 >> 7;
        pbVar7 = pbVar3 + 1;
        bVar1 = 0x3fff < uVar6;
        uVar6 = uVar2;
      } while (bVar1);
      *pbVar3 = (byte)uVar2;
    }
  }
  output->cur_ = pbVar7;
  uVar8 = value >> 0x3f ^ value * 2;
  if ((output->impl_).end_ <= pbVar7) {
    puVar4 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,pbVar7);
    output->cur_ = puVar4;
  }
  pbVar7 = output->cur_;
  if (uVar8 < 0x80) {
    *pbVar7 = (byte)uVar8;
    pbVar7 = pbVar7 + 1;
  }
  else {
    *pbVar7 = (byte)uVar8 | 0x80;
    if (uVar8 < 0x4000) {
      pbVar7[1] = (byte)(uVar8 >> 7);
      pbVar7 = pbVar7 + 2;
    }
    else {
      pbVar7 = pbVar7 + 2;
      uVar8 = uVar8 >> 7;
      do {
        pbVar3 = pbVar7;
        pbVar3[-1] = (byte)uVar8 | 0x80;
        uVar5 = uVar8 >> 7;
        pbVar7 = pbVar3 + 1;
        bVar1 = 0x3fff < uVar8;
        uVar8 = uVar5;
      } while (bVar1);
      *pbVar3 = (byte)uVar5;
    }
  }
  output->cur_ = pbVar7;
  return;
}

Assistant:

void WireFormatLite::WriteSInt64(int field_number, int64 value,
                                 io::CodedOutputStream* output) {
  WriteTag(field_number, WIRETYPE_VARINT, output);
  WriteSInt64NoTag(value, output);
}